

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

void __thiscall pbrt::BilinearPatch::BilinearPatch(BilinearPatch *this,int meshIndex,int blpIndex)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  undefined4 *puVar13;
  long lVar14;
  long lVar15;
  undefined4 *puVar16;
  long lVar17;
  undefined1 *puVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM19 [16];
  Point3f p [4] [4];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  undefined1 extraout_var [60];
  
  this->meshIndex = meshIndex;
  this->blpIndex = blpIndex;
  *(long *)(in_FS_OFFSET + -0x458) = *(long *)(in_FS_OFFSET + -0x458) + 0xc;
  lVar15 = *(long *)(*(long *)(allMeshes + 8) + (long)meshIndex * 8);
  lVar14 = (long)(blpIndex << 2);
  lVar17 = *(long *)(lVar15 + 0x10);
  lVar15 = *(long *)(lVar15 + 0x18);
  pfVar1 = (float *)(lVar15 + (long)*(int *)(lVar17 + lVar14 * 4) * 0xc);
  pfVar2 = (float *)(lVar15 + (long)*(int *)(lVar17 + 4 + lVar14 * 4) * 0xc);
  pfVar3 = (float *)(lVar15 + (long)*(int *)(lVar17 + 8 + lVar14 * 4) * 0xc);
  lVar17 = (long)*(int *)(lVar17 + 0xc + lVar14 * 4);
  bVar12 = IsRectangle(this);
  if (bVar12) {
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)((pfVar1[1] - pfVar3[1]) * (pfVar1[1] - pfVar3[1]))),
                              ZEXT416((uint)(*pfVar1 - *pfVar3)),ZEXT416((uint)(*pfVar1 - *pfVar3)))
    ;
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)(pfVar1[2] - pfVar3[2])),
                              ZEXT416((uint)(pfVar1[2] - pfVar3[2])));
    if (auVar26._0_4_ < 0.0) {
      fVar22 = sqrtf(auVar26._0_4_);
    }
    else {
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      fVar22 = auVar26._0_4_;
    }
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)((pfVar1[1] - pfVar2[1]) * (pfVar1[1] - pfVar2[1]))),
                              ZEXT416((uint)(*pfVar1 - *pfVar2)),ZEXT416((uint)(*pfVar1 - *pfVar2)))
    ;
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)(pfVar1[2] - pfVar2[2])),
                              ZEXT416((uint)(pfVar1[2] - pfVar2[2])));
    if (auVar26._0_4_ < 0.0) {
      fVar23 = sqrtf(auVar26._0_4_);
    }
    else {
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      fVar23 = auVar26._0_4_;
    }
    this->area = fVar22 * fVar23;
  }
  else {
    local_78 = ZEXT1664(ZEXT816(0) << 0x40);
    puVar13 = (undefined4 *)(local_f8 + 8);
    local_b8 = local_78;
    local_f8 = local_78;
    fVar22 = pfVar1[2];
    fVar23 = pfVar3[2];
    fVar4 = pfVar2[2];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)pfVar1;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)pfVar3;
    uVar6 = *(undefined8 *)pfVar2;
    uVar7 = *(undefined8 *)(lVar15 + lVar17 * 0xc);
    uVar5 = *(uint *)(lVar15 + 8 + lVar17 * 0xc);
    lVar15 = 0;
    do {
      auVar28 = vcvtsi2ss_avx512f(in_XMM19,(int)lVar15);
      auVar27._0_4_ = auVar28._0_4_ / 3.0;
      auVar27._4_12_ = auVar28._4_12_;
      fVar9 = 1.0 - auVar27._0_4_;
      auVar28._4_4_ = fVar9;
      auVar28._0_4_ = fVar9;
      auVar28._8_4_ = fVar9;
      auVar28._12_4_ = fVar9;
      lVar17 = 0;
      puVar16 = puVar13;
      do {
        auVar19 = vcvtsi2ss_avx512f(in_XMM19,(int)lVar17);
        auVar29._0_4_ = auVar19._0_4_ / 3.0;
        auVar29._4_12_ = auVar19._4_12_;
        fVar10 = 1.0 - auVar29._0_4_;
        auVar19 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar22));
        auVar20 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar23));
        auVar19 = vaddss_avx512f(auVar19,auVar20);
        auVar20 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar4));
        auVar21 = vmulss_avx512f(auVar29,ZEXT416(uVar5));
        auVar20 = vaddss_avx512f(auVar20,auVar21);
        auVar19 = vmulss_avx512f(ZEXT416((uint)fVar9),auVar19);
        auVar20 = vmulss_avx512f(auVar27,auVar20);
        auVar19 = vaddss_avx512f(auVar19,auVar20);
        auVar20._4_4_ = fVar10;
        auVar20._0_4_ = fVar10;
        auVar20._8_4_ = fVar10;
        auVar20._12_4_ = fVar10;
        auVar20 = vmulps_avx512vl(auVar20,auVar26);
        auVar21._4_4_ = auVar29._0_4_;
        auVar21._0_4_ = auVar29._0_4_;
        auVar21._8_4_ = auVar29._0_4_;
        auVar21._12_4_ = auVar29._0_4_;
        auVar21 = vmulps_avx512vl(auVar21,auVar25);
        auVar20 = vaddps_avx512vl(auVar20,auVar21);
        auVar20 = vmulps_avx512vl(auVar28,auVar20);
        auVar30._0_4_ = auVar27._0_4_ * (fVar10 * (float)uVar6 + auVar29._0_4_ * (float)uVar7);
        auVar30._4_4_ =
             auVar27._0_4_ *
             (fVar10 * (float)((ulong)uVar6 >> 0x20) + auVar29._0_4_ * (float)((ulong)uVar7 >> 0x20)
             );
        auVar30._8_4_ = auVar27._0_4_ * (fVar10 * 0.0 + auVar29._0_4_ * 0.0);
        auVar30._12_4_ = auVar27._0_4_ * (fVar10 * 0.0 + auVar29._0_4_ * 0.0);
        auVar20 = vaddps_avx512vl(auVar20,auVar30);
        uVar8 = vmovlps_avx(auVar20);
        *(undefined8 *)(puVar16 + -2) = uVar8;
        *puVar16 = auVar19._0_4_;
        lVar17 = lVar17 + 1;
        puVar16 = puVar16 + 3;
      } while (lVar17 != 4);
      lVar15 = lVar15 + 1;
      puVar13 = puVar13 + 0xc;
    } while (lVar15 != 4);
    this->area = 0.0;
    puVar18 = local_b8 + 4;
    lVar15 = 0;
    do {
      lVar15 = lVar15 + 1;
      lVar17 = -0x24;
      do {
        fVar23 = *(float *)(puVar18 + lVar17 + 0x1c) - *(float *)(puVar18 + lVar17 + -0x20);
        fVar4 = *(float *)(puVar18 + lVar17 + 0x20) - *(float *)(puVar18 + lVar17 + -0x1c);
        fVar22 = *(float *)(puVar18 + lVar17 + 0x24) - *(float *)(puVar18 + lVar17 + -0x18);
        fVar9 = *(float *)(puVar18 + lVar17 + 0x10) - *(float *)(puVar18 + lVar17 + -0x14);
        fVar10 = *(float *)(puVar18 + lVar17 + 0x14) - *(float *)(puVar18 + lVar17 + -0x10);
        fVar11 = *(float *)(puVar18 + lVar17 + 0x18) - *(float *)(puVar18 + lVar17 + -0xc);
        auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar4),
                                  ZEXT416((uint)(fVar22 * fVar10)));
        auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar10)),ZEXT416((uint)fVar22),
                                   ZEXT416((uint)fVar10));
        auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar22),ZEXT416((uint)fVar9),
                                  ZEXT416((uint)(fVar23 * fVar11)));
        auVar28 = vfnmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar23),
                                   ZEXT416((uint)(fVar23 * fVar11)));
        fVar22 = auVar25._0_4_ + auVar28._0_4_;
        auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar23),
                                  ZEXT416((uint)(fVar4 * fVar9)));
        auVar28 = vfnmadd213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar4),
                                   ZEXT416((uint)(fVar4 * fVar9)));
        auVar26 = ZEXT416((uint)(auVar27._0_4_ + auVar26._0_4_));
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar22)),auVar26,auVar26);
        auVar25 = ZEXT416((uint)(auVar28._0_4_ + auVar25._0_4_));
        auVar26 = vfmadd231ss_fma(auVar26,auVar25,auVar25);
        if (auVar26._0_4_ < 0.0) {
          auVar24._0_4_ = sqrtf(auVar26._0_4_);
          auVar24._4_60_ = extraout_var;
          auVar26 = auVar24._0_16_;
        }
        else {
          auVar26 = vsqrtss_avx(auVar26,auVar26);
        }
        auVar26 = vfmadd213ss_fma(auVar26,SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)this->area));
        this->area = auVar26._0_4_;
        lVar17 = lVar17 + 0xc;
      } while (lVar17 != 0);
      puVar18 = puVar18 + 0x30;
    } while (lVar15 != 3);
  }
  return;
}

Assistant:

BilinearPatch::BilinearPatch(int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    if (IsRectangle())
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}